

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetTableNum(void *arkode_mem,ARKODE_DIRKTableID itable,ARKODE_ERKTableID etable)

{
  int iVar1;
  ARKodeButcherTable pAVar2;
  int in_EDX;
  int in_ESI;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  int flag;
  ARKODE_ERKTableID in_stack_000000bc;
  ARKODE_DIRKTableID in_stack_000000dc;
  ARKodeMem *in_stack_ffffffffffffffb8;
  ARKodeButcherTable in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  long local_30;
  ARKodeMem local_28;
  int local_4;
  
  local_4 = arkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8,(ARKodeARKStepMem *)0x11f6ac);
  if (local_4 == 0) {
    *(undefined4 *)(local_30 + 0x6c) = 0;
    *(undefined4 *)(local_30 + 0x60) = 0;
    *(undefined4 *)(local_30 + 100) = 0;
    ARKodeButcherTable_Space
              (*(ARKodeButcherTable *)(local_30 + 0x70),(sunindextype *)&stack0xffffffffffffffc0,
               (sunindextype *)&stack0xffffffffffffffc8);
    ARKodeButcherTable_Free(in_stack_ffffffffffffffc0);
    *(undefined8 *)(local_30 + 0x70) = 0;
    local_28->liw = local_28->liw - (long)in_stack_ffffffffffffffc0;
    local_28->lrw = local_28->lrw - (long)in_stack_ffffffffffffffc8;
    ARKodeButcherTable_Space
              (*(ARKodeButcherTable *)(local_30 + 0x78),(sunindextype *)&stack0xffffffffffffffc0,
               (sunindextype *)&stack0xffffffffffffffc8);
    ARKodeButcherTable_Free(in_stack_ffffffffffffffc0);
    *(undefined8 *)(local_30 + 0x78) = 0;
    local_28->liw = local_28->liw - (long)in_stack_ffffffffffffffc0;
    local_28->lrw = local_28->lrw - (long)in_stack_ffffffffffffffc8;
    if ((in_ESI < 0) && (in_EDX < 0)) {
      arkProcessError(local_28,-0x15,0x177,"ARKStepSetTableNum",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                      ,"At least one valid table number must be supplied");
      local_4 = -0x16;
    }
    else {
      if (in_ESI < 0) {
        if ((in_EDX < 0) || (0x1a < in_EDX)) {
          arkProcessError(local_28,-0x15,0x182,"ARKStepSetTableNum",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"Illegal ERK table number");
          return -0x16;
        }
        pAVar2 = ARKodeButcherTable_LoadERK(in_stack_000000bc);
        *(ARKodeButcherTable *)(local_30 + 0x70) = pAVar2;
        if (*(long *)(local_30 + 0x70) == 0) {
          arkProcessError(local_28,-0x15,0x18b,"ARKStepSetTableNum",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"Error setting explicit table with that index");
          return -0x16;
        }
        *(undefined4 *)(local_30 + 0x6c) = *(undefined4 *)(*(long *)(local_30 + 0x70) + 8);
        *(undefined4 *)(local_30 + 0x60) = **(undefined4 **)(local_30 + 0x70);
        *(undefined4 *)(local_30 + 100) = *(undefined4 *)(*(long *)(local_30 + 0x70) + 4);
        iVar1 = ARKStepSetExplicit(in_stack_ffffffffffffffc8);
        if (iVar1 != 0) {
          arkProcessError(local_28,-0x16,0x197,"ARKStepSetTableNum",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"Error in ARKStepSetExplicit");
          return iVar1;
        }
      }
      else if (in_EDX < 0) {
        if ((in_ESI < 100) || (0x7e < in_ESI)) {
          arkProcessError(local_28,-0x15,0x1a3,"ARKStepSetTableNum",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"Illegal IRK table number");
          return -0x16;
        }
        pAVar2 = ARKodeButcherTable_LoadDIRK(in_stack_000000dc);
        *(ARKodeButcherTable *)(local_30 + 0x78) = pAVar2;
        if (*(long *)(local_30 + 0x78) == 0) {
          arkProcessError(local_28,-0x15,0x1ac,"ARKStepSetTableNum",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"Error setting table with that index");
          return -0x16;
        }
        *(undefined4 *)(local_30 + 0x6c) = *(undefined4 *)(*(long *)(local_30 + 0x78) + 8);
        *(undefined4 *)(local_30 + 0x60) = **(undefined4 **)(local_30 + 0x78);
        *(undefined4 *)(local_30 + 100) = *(undefined4 *)(*(long *)(local_30 + 0x78) + 4);
        iVar1 = ARKStepSetImplicit(in_stack_ffffffffffffffc8);
        if (iVar1 != 0) {
          arkProcessError(local_28,-0x16,0x1b8,"ARKStepSetTableNum",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"Error in ARKStepSetImplicit");
          return iVar1;
        }
      }
      else {
        if ((((((in_EDX != 2) || (in_ESI != 0x68)) && ((in_EDX != 4 || (in_ESI != 0x6d)))) &&
             ((in_EDX != 0xd || (in_ESI != 0x70)))) && ((in_EDX != 9 || (in_ESI != 0x6f)))) &&
           (((in_EDX != 0xe || (in_ESI != 0x71)) && ((in_EDX != 0xf || (in_ESI != 0x7b)))))) {
          arkProcessError(local_28,-0x16,0x1ce,"ARKStepSetTableNum",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"Incompatible Butcher tables for ARK method");
          return -0x16;
        }
        pAVar2 = ARKodeButcherTable_LoadDIRK(in_stack_000000dc);
        *(ARKodeButcherTable *)(local_30 + 0x78) = pAVar2;
        pAVar2 = ARKodeButcherTable_LoadERK(in_stack_000000bc);
        *(ARKodeButcherTable *)(local_30 + 0x70) = pAVar2;
        if (*(long *)(local_30 + 0x78) == 0) {
          arkProcessError(local_28,-0x15,0x1d8,"ARKStepSetTableNum",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"Illegal IRK table number");
          return -0x16;
        }
        if (*(long *)(local_30 + 0x70) == 0) {
          arkProcessError(local_28,-0x15,0x1de,"ARKStepSetTableNum",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"Illegal ERK table number");
          return -0x16;
        }
        *(undefined4 *)(local_30 + 0x6c) = *(undefined4 *)(*(long *)(local_30 + 0x78) + 8);
        *(undefined4 *)(local_30 + 0x60) = **(undefined4 **)(local_30 + 0x78);
        *(undefined4 *)(local_30 + 100) = *(undefined4 *)(*(long *)(local_30 + 0x78) + 4);
        iVar1 = ARKStepSetImEx(in_stack_ffffffffffffffc8);
        if (iVar1 != 0) {
          arkProcessError(local_28,-0x16,0x1e9,"ARKStepSetTableNum",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,
                          "Cannot specify that method is ImEx without providing function pointers to fi(t,y) and fe(t,y)."
                         );
          return -0x16;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetTableNum(void* arkode_mem, ARKODE_DIRKTableID itable,
                       ARKODE_ERKTableID etable)
{
  int flag, retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q      = 0;
  step_mem->p      = 0;

  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /* determine mode (implicit/explicit/ImEx), and perform
     appropriate actions  */

  /*     illegal inputs */
  if ((itable < 0) && (etable < 0))
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "At least one valid table number must be supplied");
    return (ARK_ILL_INPUT);

    /* explicit */
  }
  else if (itable < 0)
  {
    /* check that argument specifies an explicit table */
    if (etable < ARKODE_MIN_ERK_NUM || etable > ARKODE_MAX_ERK_NUM)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Illegal ERK table number");
      return (ARK_ILL_INPUT);
    }

    /* fill in table based on argument */
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
    if (step_mem->Be == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Error setting explicit table with that index");
      return (ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Be->stages;
    step_mem->q      = step_mem->Be->q;
    step_mem->p      = step_mem->Be->p;

    /* set method as purely explicit */
    flag = ARKStepSetExplicit(arkode_mem);
    if (flag != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Error in ARKStepSetExplicit");
      return (flag);
    }

    /* implicit */
  }
  else if (etable < 0)
  {
    /* check that argument specifies an implicit table */
    if (itable < ARKODE_MIN_DIRK_NUM || itable > ARKODE_MAX_DIRK_NUM)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Illegal IRK table number");
      return (ARK_ILL_INPUT);
    }

    /* fill in table based on argument */
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);
    if (step_mem->Bi == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Error setting table with that index");
      return (ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q      = step_mem->Bi->q;
    step_mem->p      = step_mem->Bi->p;

    /* set method as purely implicit */
    flag = ARKStepSetImplicit(arkode_mem);
    if (flag != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Error in ARKStepSetImplicit");
      return (flag);
    }

    /* ImEx */
  }
  else
  {
    /* ensure that tables match */
    if (!((etable == ARKODE_ARK324L2SA_ERK_4_2_3) &&
          (itable == ARKODE_ARK324L2SA_DIRK_4_2_3)) &&
        !((etable == ARKODE_ARK436L2SA_ERK_6_3_4) &&
          (itable == ARKODE_ARK436L2SA_DIRK_6_3_4)) &&
        !((etable == ARKODE_ARK437L2SA_ERK_7_3_4) &&
          (itable == ARKODE_ARK437L2SA_DIRK_7_3_4)) &&
        !((etable == ARKODE_ARK548L2SA_ERK_8_4_5) &&
          (itable == ARKODE_ARK548L2SA_DIRK_8_4_5)) &&
        !((etable == ARKODE_ARK548L2SAb_ERK_8_4_5) &&
          (itable == ARKODE_ARK548L2SAb_DIRK_8_4_5)) &&
        !((etable == ARKODE_ARK2_ERK_3_1_2) && (itable == ARKODE_ARK2_DIRK_3_1_2)))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Incompatible Butcher tables for ARK method");
      return (ARK_ILL_INPUT);
    }

    /* fill in tables based on arguments */
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
    if (step_mem->Bi == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Illegal IRK table number");
      return (ARK_ILL_INPUT);
    }
    if (step_mem->Be == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Illegal ERK table number");
      return (ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q      = step_mem->Bi->q;
    step_mem->p      = step_mem->Bi->p;

    /* set method as ImEx */
    if (ARKStepSetImEx(arkode_mem) != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_MISSING_F);
      return (ARK_ILL_INPUT);
    }
  }

  return (ARK_SUCCESS);
}